

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhStoreCell(lhpage *pPage,void *pKey,sxu32 nKeyLen,void *pData,unqlite_int64 nDataLen,
               sxu32 nHash,int auto_append)

{
  lhash_kv_engine *pEngine;
  int iVar1;
  int iVar2;
  int iVar3;
  lhcell *pCell;
  lhpage *pSlave;
  sxu16 local_4e;
  sxu32 local_4c;
  void *local_48;
  void *local_40;
  lhpage *local_38;
  
  pEngine = pPage->pHash;
  local_48 = pKey;
  local_40 = pData;
  iVar1 = (*pEngine->pIo->xWrite)(pPage->pRaw);
  if (iVar1 == 0) {
    local_4c = nHash;
    iVar2 = lhAllocateSpace(pPage,(ulong)(nKeyLen + 0x1a) + nDataLen,&local_4e);
    if ((iVar2 != 0) && (iVar1 = lhAllocateSpace(pPage,0x1a,&local_4e), iVar1 != 0)) {
      if (auto_append == 0) {
        return -0x49;
      }
      iVar1 = lhFindSlavePage(pPage,(ulong)nKeyLen + nDataLen,(sxu16 *)0x0,&local_38);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = lhStoreCell(local_38,local_48,nKeyLen,local_40,nDataLen,local_4c,1);
      return iVar1;
    }
    pCell = lhNewCell(pEngine,pPage);
    if (pCell == (lhcell *)0x0) {
      (*pEngine->pIo->xErr)(pEngine->pIo->pHandle,"KV store is running out of memory");
      iVar1 = -1;
    }
    else {
      pCell->iStart = local_4e;
      pCell->nKey = nKeyLen;
      pCell->nData = nDataLen;
      pCell->nHash = local_4c;
      if (nKeyLen < 0x40000) {
        SyBlobAppend(&pCell->sKey,local_48,nKeyLen);
      }
      iVar3 = lhInstallCell(pCell);
      iVar1 = -1;
      if (iVar3 == 0) {
        if (iVar2 == 0) {
          lhCellWriteLocalPayload(pCell,local_48,nKeyLen,local_40,nDataLen);
        }
        else {
          iVar1 = lhCellWriteOvflPayload(pCell,local_48,nKeyLen,local_40,nDataLen,0);
          if (iVar1 != 0) {
            lhCellDiscard(pCell);
            return iVar1;
          }
        }
        lhCellWriteHeader(pCell);
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

static int lhStoreCell(
	lhpage *pPage, /* Target page */
	const void *pKey,sxu32 nKeyLen, /* Payload: Key */
	const void *pData,unqlite_int64 nDataLen, /* Payload: Data */
	sxu32 nHash, /* Hash of the key */
	int auto_append /* Auto append a slave page if full */
	)
{
	lhash_kv_engine *pEngine = pPage->pHash;
	int iNeedOvfl = 0; /* Need overflow page for this cell and its payload*/
	lhcell *pCell;
	sxu16 nOfft;
	int rc;
	/* Acquire a writer lock on this page first */
	rc = pEngine->pIo->xWrite(pPage->pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Check for a free block  */
	rc = lhAllocateSpace(pPage,L_HASH_CELL_SZ+nKeyLen+nDataLen,&nOfft);
	if( rc != UNQLITE_OK ){
		/* Check for a free block to hold a single cell only (without payload) */
		rc = lhAllocateSpace(pPage,L_HASH_CELL_SZ,&nOfft);
		if( rc != UNQLITE_OK ){
			if( !auto_append ){
				/* A split must be done */
				return UNQLITE_FULL;
			}else{
				/* Store this record in a slave page */
				rc = lhSlaveStore(pPage,pKey,nKeyLen,pData,nDataLen,nHash);
				return rc;
			}
		}
		iNeedOvfl = 1;
	}
	/* Allocate a new cell instance */
	pCell = lhNewCell(pEngine,pPage);
	if( pCell == 0 ){
		pEngine->pIo->xErr(pEngine->pIo->pHandle,"KV store is running out of memory");
		return UNQLITE_NOMEM;
	}
	/* Fill-in the structure */
	pCell->iStart = nOfft;
	pCell->nKey = nKeyLen;
	pCell->nData = (sxu64)nDataLen;
	pCell->nHash = nHash;
	if( nKeyLen < 262144 /* 256 KB */ ){
		/* Keep the key in-memory for fast lookup */
		SyBlobAppend(&pCell->sKey,pKey,nKeyLen);
	}
	/* Link the cell */
	rc = lhInstallCell(pCell);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Write the payload */
	if( iNeedOvfl ){
		rc = lhCellWriteOvflPayload(pCell,pKey,nKeyLen,pData,nDataLen,(const void *)0);
		if( rc != UNQLITE_OK ){
			lhCellDiscard(pCell);
			return rc;
		}
	}else{
		lhCellWriteLocalPayload(pCell,pKey,nKeyLen,pData,nDataLen);
	}
	/* Finally, Write the cell header */
	lhCellWriteHeader(pCell);
	/* All done */
	return UNQLITE_OK;
}